

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  unsigned_long *puVar1;
  cmGeneratorTarget *target;
  cmLocalUnixMakefileGenerator3 *lg;
  cmMakefile *pcVar2;
  bool bVar3;
  string *psVar4;
  cmOutputConverter *this_00;
  string_view source;
  EchoProgress progress;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string targetOutput;
  string local_e8;
  string local_c8;
  string buildEcho;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  target = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  lg = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&progress.Dir,&this->super_cmMakefileTargetGenerator);
  bVar3 = requireDeviceLinking(target,(cmLocalGenerator *)lg,&progress.Dir);
  std::__cxx11::string::~string((string *)&progress);
  if (bVar3) {
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&progress,"CMAKE_CUDA_OUTPUT_EXTENSION",(allocator<char> *)&local_88);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar2,&progress.Dir);
    std::__cxx11::string::~string((string *)&progress);
    std::operator+(&progress.Dir,
                   &((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget)->ObjectDirectory,"cmake_device_link");
    std::operator+(&targetOutput,&progress.Dir,psVar4);
    std::__cxx11::string::~string((string *)&progress);
    std::__cxx11::string::_M_assign((string *)&this->DeviceLinkObject);
    puVar1 = &(this->super_cmMakefileTargetGenerator).NumberOfProgressActions;
    *puVar1 = *puVar1 + 1;
    if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
      progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
      progress.Dir._M_string_length = 0;
      progress.Dir.field_2._M_local_buf[0] = '\0';
      progress.Arg._M_dataplus._M_p = (pointer)&progress.Arg.field_2;
      progress.Arg._M_string_length = 0;
      progress.Arg.field_2._M_local_buf[0] = '\0';
      cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,&progress);
      local_88.View_._M_len = 0x19;
      local_88.View_._M_str = "Linking CUDA device code ";
      this_00 = &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                 super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      cmOutputConverter::MaybeRelativeToCurBinDir(&local_e8,this_00,&this->DeviceLinkObject);
      source._M_str = local_e8._M_dataplus._M_p;
      source._M_len = local_e8._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_c8,this_00,source,SHELL);
      local_58.View_._M_len = local_c8._M_string_length;
      local_58.View_._M_str = local_c8._M_dataplus._M_p;
      cmStrCat<>(&buildEcho,&local_88,&local_58);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      cmLocalUnixMakefileGenerator3::AppendEcho
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,&commands,&buildEcho,
                 EchoLink,&progress);
      std::__cxx11::string::~string((string *)&buildEcho);
      cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress(&progress);
    }
    pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&progress,"CMAKE_CUDA_COMPILER_ID",(allocator<char> *)&local_88);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar2,&progress.Dir);
    bVar3 = std::operator==(psVar4,"Clang");
    std::__cxx11::string::~string((string *)&progress);
    if (bVar3) {
      cmMakefileTargetGenerator::WriteDeviceLinkRule
                (&this->super_cmMakefileTargetGenerator,&commands,&targetOutput);
    }
    else {
      (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
        _vptr_cmCommonTargetGenerator[8])(this,(ulong)relink,&commands,&targetOutput);
    }
    cmMakefileTargetGenerator::WriteTargetDriverRule
              (&this->super_cmMakefileTargetGenerator,&targetOutput,relink);
    std::__cxx11::string::~string((string *)&targetOutput);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands);
  }
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule(
  bool relink)
{
#ifndef CMAKE_BOOTSTRAP
  const bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
  if (!requiresDeviceLinking) {
    return;
  }

  std::vector<std::string> commands;

  // Get the name of the device object to generate.
  std::string const& objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");
  std::string const targetOutput =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutput;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = cmStrCat(
      "Linking CUDA device code ",
      this->LocalGenerator->ConvertToOutputFormat(
        this->LocalGenerator->MaybeRelativeToCurBinDir(this->DeviceLinkObject),
        cmOutputConverter::SHELL));
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }

  if (this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_ID") == "Clang") {
    this->WriteDeviceLinkRule(commands, targetOutput);
  } else {
    this->WriteNvidiaDeviceExecutableRule(relink, commands, targetOutput);
  }

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutput, relink);
#else
  static_cast<void>(relink);
#endif
}